

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int DataManager::getCount(int element,int *count,Network *nw)

{
  pointer ppNVar1;
  int iVar2;
  int iVar3;
  ElementType eType;
  pointer ppNVar4;
  
  *count = 0;
  iVar2 = 0;
  switch(element) {
  case 0:
    eType = NODE;
    break;
  case 1:
    ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar4 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
      iVar2 = (*((*ppNVar4)->super_Element)._vptr_Element[2])();
      if (iVar2 == 1) {
        *count = *count + 1;
      }
    }
    return 0;
  case 2:
    eType = LINK;
    break;
  case 3:
    eType = PATTERN;
    break;
  case 4:
    eType = CURVE;
    break;
  case 5:
    eType = CONTROL;
    break;
  case 6:
    goto switchD_0012102b_caseD_6;
  case 7:
    ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar4 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
      iVar2 = (*((*ppNVar4)->super_Element)._vptr_Element[2])();
      if (iVar2 == 2) {
        *count = *count + 1;
      }
    }
    return 0;
  default:
    iVar2 = 0xcb;
    goto switchD_0012102b_caseD_6;
  }
  iVar2 = 0;
  iVar3 = Network::count(nw,eType);
  *count = iVar3;
switchD_0012102b_caseD_6:
  return iVar2;
}

Assistant:

int DataManager::getCount(int element, int* count, Network* nw)
{
    int err = 0;
    *count = 0;
    switch (element)
    {
    case EN_NODECOUNT:    *count = nw->count(Element::NODE); break;
    case EN_LINKCOUNT:    *count = nw->count(Element::LINK); break;
    case EN_PATCOUNT:     *count = nw->count(Element::PATTERN); break;
    case EN_CURVECOUNT:   *count = nw->count(Element::CURVE); break;
    case EN_CONTROLCOUNT: *count = nw->count(Element::CONTROL); break;
    case EN_RULECOUNT:    break;
    case EN_TANKCOUNT:
        for (Node* node : nw->nodes) if ( node->type() == Node::TANK ) (*count)++;
        break;
    case EN_RESVCOUNT:
        for (Node* node : nw->nodes) if ( node->type() == Node::RESERVOIR ) (*count)++;
         break;
    default: err = 203;
    }
    return err;
}